

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_unlk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 arg;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  pTVar1 = get_areg(s,insn & 7);
  tcg_gen_mov_i32(tcg_ctx_00,ret,pTVar1);
  arg = gen_load(s,2,ret,0,(uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  tcg_gen_mov_i32(tcg_ctx_00,pTVar1,arg);
  pTVar1 = get_areg(s,7);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,pTVar1,ret,4);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  return;
}

Assistant:

DISAS_INSN(unlk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    TCGv tmp;

    src = tcg_temp_new(tcg_ctx);
    reg = AREG(insn, 0);
    tcg_gen_mov_i32(tcg_ctx, src, reg);
    tmp = gen_load(s, OS_LONG, src, 0, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, src, 4);
    tcg_temp_free(tcg_ctx, src);
    tcg_temp_free(tcg_ctx, tmp);
}